

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapinfo.cpp
# Opt level: O1

vector<ItemInfo,_std::allocator<ItemInfo>_> * __thiscall
MapInfo::getAllMapInfo
          (vector<ItemInfo,_std::allocator<ItemInfo>_> *__return_storage_ptr__,MapInfo *this)

{
  iterator iVar1;
  _List_node_base *p_Var2;
  Vec2 VVar3;
  ulong uVar4;
  MapInfo *pMVar5;
  iterator __end1;
  ItemInfo w;
  ItemInfo i;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  int iStack_50;
  _List_node_base *local_48;
  float fStack_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  int iStack_30;
  
  (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar5 = (MapInfo *)
           (this->wards).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (pMVar5 != this) {
    do {
      local_68 = (_List_node_base *)
                 (pMVar5->wards).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl.
                 _M_node._M_size;
      VVar3 = (Vec2)(pMVar5->bombs).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl.
                    _M_node.super__List_node_base._M_next;
      uVar4 = *(ulong *)((long)&(pMVar5->bombs).
                                super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl.
                                _M_node.super__List_node_base._M_prev + 4);
      fStack_58 = (float)((ulong)*(undefined8 *)
                                  ((long)&(pMVar5->bombs).
                                          super__List_base<ItemInfo,_std::allocator<ItemInfo>_>.
                                          _M_impl._M_node.super__List_node_base._M_next + 4) >> 0x20
                         );
      fStack_54 = (float)uVar4;
      iStack_50 = (int)(uVar4 >> 0x20);
      fStack_60 = VVar3.x;
      fStack_5c = VVar3.y;
      fStack_38 = fStack_58;
      iStack_30 = 0;
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      local_48 = local_68;
      fStack_40 = fStack_60;
      fStack_3c = fStack_5c;
      fStack_34 = fStack_54;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<ItemInfo,std::allocator<ItemInfo>>::_M_realloc_insert<ItemInfo_const&>
                  ((vector<ItemInfo,std::allocator<ItemInfo>> *)__return_storage_ptr__,iVar1,
                   (ItemInfo *)&local_48);
      }
      else {
        *(ulong *)&((iVar1._M_current)->pos).y = CONCAT44(fStack_58,fStack_5c);
        *(ulong *)&((iVar1._M_current)->velocity).y = uVar4 & 0xffffffff;
        *(_List_node_base **)iVar1._M_current = local_68;
        (iVar1._M_current)->pos = VVar3;
        (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      pMVar5 = (MapInfo *)
               (pMVar5->wards).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node
               .super__List_node_base._M_next;
    } while (pMVar5 != this);
  }
  for (p_Var2 = (this->bombs).super__List_base<ItemInfo,_std::allocator<ItemInfo>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->bombs;
      p_Var2 = p_Var2->_M_next) {
    fStack_38 = SUB84(p_Var2[2]._M_next,0);
    fStack_34 = (float)((ulong)p_Var2[2]._M_next >> 0x20);
    local_68 = p_Var2[1]._M_next;
    VVar3 = (Vec2)p_Var2[1]._M_prev;
    fStack_40 = VVar3.x;
    fStack_3c = VVar3.y;
    iStack_50 = *(int *)&p_Var2[2]._M_prev;
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_48 = local_68;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      fStack_60 = fStack_40;
      fStack_5c = fStack_3c;
      fStack_58 = fStack_38;
      fStack_54 = fStack_34;
      std::vector<ItemInfo,std::allocator<ItemInfo>>::_M_realloc_insert<ItemInfo_const&>
                ((vector<ItemInfo,std::allocator<ItemInfo>> *)__return_storage_ptr__,iVar1,
                 (ItemInfo *)&local_68);
    }
    else {
      *(ulong *)&((iVar1._M_current)->pos).y = CONCAT44(fStack_38,fStack_3c);
      *(ulong *)&((iVar1._M_current)->velocity).y = CONCAT44(iStack_50,fStack_34);
      *(_List_node_base **)iVar1._M_current = local_68;
      (iVar1._M_current)->pos = VVar3;
      (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  for (p_Var2 = (this->deaths).
                super__List_base<MapInfo::DeathInfo,_std::allocator<MapInfo::DeathInfo>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)&this->deaths;
      p_Var2 = p_Var2->_M_next) {
    VVar3 = *(Vec2 *)((long)&p_Var2[1]._M_next + 4);
    fStack_58 = 0.0;
    fStack_54 = 0.0;
    uVar4 = (ulong)local_68 >> 0x20;
    local_68 = (_List_node_base *)CONCAT44((int)uVar4,*(undefined4 *)&p_Var2[1]._M_next);
    fStack_60 = VVar3.x;
    fStack_5c = VVar3.y;
    iStack_50 = 2;
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ItemInfo,std::allocator<ItemInfo>>::_M_realloc_insert<ItemInfo_const&>
                ((vector<ItemInfo,std::allocator<ItemInfo>> *)__return_storage_ptr__,iVar1,
                 (ItemInfo *)&local_68);
    }
    else {
      *(ulong *)&((iVar1._M_current)->pos).y = (ulong)(uint)fStack_5c;
      *(undefined8 *)&((iVar1._M_current)->velocity).y = 0x200000000;
      *(_List_node_base **)iVar1._M_current = local_68;
      (iVar1._M_current)->pos = VVar3;
      (__return_storage_ptr__->super__Vector_base<ItemInfo,_std::allocator<ItemInfo>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ItemInfo> MapInfo::getAllMapInfo()
{
    vector<ItemInfo> res;
    //Use life as the type
    for (auto w : wards)
    {
        ItemInfo i = w;
        i.life = 0;
        res.push_back(i);
    }
    for (auto b : bombs)
    {
        ItemInfo i = b;
        b.life = 1;
        res.push_back(i);
    }
    for (auto c : deaths)
    {
        ItemInfo i;
        i.id = c.id;
        i.pos = c.pos;
        i.life = 2;
        res.push_back(i);
    }
    return res;
}